

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O2

char * __thiscall
CTcDataStream::get_block_ptr(CTcDataStream *this,ulong ofs,ulong requested_len,ulong *available_len)

{
  ulong uVar1;
  
  uVar1 = 65000 - ofs % 65000;
  if (requested_len <= uVar1) {
    uVar1 = requested_len;
  }
  *available_len = uVar1;
  return this->pages_[ofs / 65000] + ofs % 65000;
}

Assistant:

const char *CTcDataStream::get_block_ptr(ulong ofs,
                                         ulong requested_len,
                                         ulong *available_len)
{
    size_t page_rem;

    /* 
     *   determine how much is left on the page containing the offset
     *   after the given offset 
     */
    page_rem = TCCS_PAGE_SIZE - (ofs % TCCS_PAGE_SIZE);

    /* 
     *   if the amount remaining on the page is greater than the request
     *   length, the available length is the entire request; otherwise,
     *   the available length is the amount remaining on the page 
     */
    if (page_rem >= requested_len)
        *available_len = requested_len;
    else
        *available_len = page_rem;

    /* return the address at this offset */
    return calc_addr(ofs);
}